

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  uint8_t *__src;
  byte bVar1;
  int iVar2;
  nn_trie_node *pnVar3;
  void *pvVar4;
  undefined4 *puVar5;
  nn_trie_node *pnVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  byte *pbVar11;
  size_t sVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  
  pnVar6 = self->root;
  do {
    if (pnVar6 == (nn_trie_node *)0x0) goto LAB_00102862;
    __src = pnVar6->prefix;
    bVar7 = pnVar6->prefix_len;
    uVar8 = (ulong)(uint)bVar7;
    if (bVar7 != 0) {
      uVar8 = 0;
      do {
        if (size == uVar8) {
          uVar8 = size & 0xffffffff;
          goto LAB_001024d0;
        }
        if (__src[uVar8] != data[uVar8]) goto LAB_001024d0;
        uVar8 = uVar8 + 1;
      } while ((uint)bVar7 != uVar8);
      uVar8 = (ulong)bVar7;
    }
LAB_001024d0:
    sVar12 = (size_t)(int)uVar8;
    pbVar11 = data + sVar12;
    lVar17 = size - sVar12;
    if ((int)uVar8 < (int)(uint)bVar7) {
      puVar5 = (undefined4 *)malloc(0x20);
      *self = (nn_trie)puVar5;
      if (puVar5 == (undefined4 *)0x0) {
        __assert_fail("*node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                      ,0x124,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
      }
      *puVar5 = 0;
      *(byte *)((long)puVar5 + 5) = (byte)uVar8;
      *(undefined1 *)(puVar5 + 1) = 1;
      memcpy((void *)((long)puVar5 + 6),__src,sVar12);
      *(uint8_t *)(*(long *)self + 0x10) = pnVar6->prefix[sVar12];
      bVar7 = ~(byte)uVar8 + pnVar6->prefix_len;
      pnVar6->prefix_len = bVar7;
      memmove(__src,__src + sVar12 + 1,(ulong)bVar7);
      pnVar6 = nn_node_compact(pnVar6);
      *(nn_trie_node **)(*(long *)self + 0x18) = pnVar6;
LAB_001025b5:
      if (size == sVar12) goto LAB_00102909;
      pvVar4 = self->root;
      uVar8 = (ulong)*(byte *)((long)pvVar4 + 4);
      if (uVar8 < 8) {
        pvVar4 = realloc(pvVar4,uVar8 * 8 + 0x20);
        *self = (nn_trie)pvVar4;
        if (pvVar4 == (void *)0x0) {
          __assert_fail("*node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                        ,0x13c,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
        }
        *(byte *)((long)pvVar4 + (ulong)*(byte *)((long)pvVar4 + 4) + 0x10) = *pbVar11;
        lVar15 = *(long *)self;
        bVar7 = *(char *)(lVar15 + 4) + 1;
        *(byte *)(lVar15 + 4) = bVar7;
        self = (nn_trie *)(lVar15 + 0x10 + (ulong)bVar7 * 8);
        ((nn_trie_node *)self)->refcount = 0;
        ((nn_trie_node *)self)->type = '\0';
        ((nn_trie_node *)self)->prefix_len = '\0';
        ((nn_trie_node *)self)->prefix[0] = '\0';
        ((nn_trie_node *)self)->prefix[1] = '\0';
      }
      else {
        if (*(byte *)((long)pvVar4 + 4) != 9) {
          bVar7 = 0xff;
          uVar10 = 0;
          bVar13 = 0;
          do {
            bVar1 = *(byte *)((long)pvVar4 + uVar10 + 0x10);
            if (bVar1 <= bVar7) {
              bVar7 = bVar1;
            }
            if (bVar1 < bVar13) {
              bVar1 = bVar13;
            }
            bVar13 = bVar1;
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
          bVar1 = *pbVar11;
          if (bVar1 <= bVar7) {
            bVar7 = bVar1;
          }
          if (bVar1 < bVar13) {
            bVar1 = bVar13;
          }
          lVar15 = (long)(int)((uint)bVar1 - (uint)bVar7);
          puVar5 = (undefined4 *)malloc(lVar15 * 8 + 0x20);
          *self = (nn_trie)puVar5;
          if (puVar5 == (undefined4 *)0x0) {
            __assert_fail("*node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                          ,0x17d,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)")
            ;
          }
          *puVar5 = 0;
          *(undefined1 *)((long)puVar5 + 5) = *(undefined1 *)((long)pvVar4 + 5);
          *(undefined1 *)(puVar5 + 1) = 9;
          memcpy((void *)((long)puVar5 + 6),(void *)((long)pvVar4 + 6),
                 (ulong)*(byte *)((long)pvVar4 + 5));
          *(byte *)(*(long *)self + 0x10) = bVar7;
          *(byte *)(*(long *)self + 0x11) = bVar1;
          *(ushort *)(*(long *)self + 0x12) = *(byte *)((long)pvVar4 + 4) + 1;
          memset((void *)(*(long *)self + 0x18),0,lVar15 * 8 + 8);
          bVar13 = *(byte *)((long)pvVar4 + 4);
          if ((ulong)bVar13 != 0) {
            uVar8 = 0;
            do {
              *(undefined8 *)
               (*(long *)self +
               ((ulong)*(byte *)((long)pvVar4 + uVar8 + 0x10) - (ulong)(uint)bVar7) * 8 + 0x18) =
                   *(undefined8 *)((long)pvVar4 + uVar8 * 8 + 0x18);
              uVar8 = uVar8 + 1;
            } while (bVar13 != uVar8);
          }
          self = (nn_trie *)nn_node_next(self->root,*pbVar11);
          data = pbVar11 + 1;
          size = lVar17 - 1;
          free(pvVar4);
LAB_00102862:
          if (self->root != (nn_trie_node *)0x0) {
            __assert_fail("!*node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                          ,0x197,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)")
            ;
          }
          uVar8 = (ulong)(10 < size);
          pnVar6 = (nn_trie_node *)malloc(uVar8 * 8 + 0x18);
          *self = (nn_trie)pnVar6;
          while( true ) {
            if (pnVar6 == (nn_trie_node *)0x0) {
              __assert_fail("*node",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                            ,0x19e,
                            "int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
            }
            pnVar6->refcount = 0;
            pnVar6->type = (uint8_t)uVar8;
            sVar12 = 10;
            if (size < 10) {
              sVar12 = size;
            }
            pnVar6->prefix_len = (uint8_t)sVar12;
            memcpy(pnVar6->prefix,data,sVar12);
            if ((uint8_t)uVar8 == '\0') break;
            uVar8 = (ulong)self->root->prefix_len;
            pbVar11 = data + uVar8;
            data = pbVar11 + 1;
            (self->root->u).sparse.children[0] = *pbVar11;
            pnVar3 = self->root;
            self = (nn_trie *)(pnVar3 + 1);
            size = size + ~uVar8;
            uVar8 = (ulong)(10 < size);
            pnVar6 = (nn_trie_node *)malloc(uVar8 * 8 + 0x18);
            *(nn_trie_node **)(pnVar3 + 1) = pnVar6;
          }
LAB_00102909:
          iVar2 = **(int **)self;
          **(int **)self = iVar2 + 1;
          return (int)(iVar2 == 0);
        }
        bVar7 = *pbVar11;
        bVar13 = *(byte *)((long)pvVar4 + 0x10);
        if ((bVar7 < bVar13) || (*(byte *)((long)pvVar4 + 0x11) < bVar7)) {
          uVar14 = (uint)bVar13;
          if (bVar7 <= bVar13) {
            uVar14 = (uint)bVar7;
          }
          uVar16 = (uint)*(byte *)((long)pvVar4 + 0x11);
          if (*(byte *)((long)pvVar4 + 0x11) <= bVar7) {
            uVar16 = (uint)bVar7;
          }
          pvVar4 = realloc(pvVar4,(long)(int)(uVar16 - uVar14) * 8 + 0x20);
          *self = (nn_trie)pvVar4;
          if (pvVar4 == (void *)0x0) {
            __assert_fail("*node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/protocols/pubsub/trie.c"
                          ,0x14f,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)")
            ;
          }
          bVar13 = *(byte *)((long)pvVar4 + 0x10);
          lVar9 = (ulong)*(byte *)((long)pvVar4 + 0x11) - (ulong)bVar13;
          lVar15 = lVar9 + 1;
          if (bVar13 == (byte)uVar14) {
            pvVar4 = (void *)((long)pvVar4 + (long)(int)lVar15 * 8);
            lVar9 = (long)(int)((uVar16 - uVar14) - (int)lVar9);
          }
          else {
            lVar9 = (long)(int)(bVar13 - uVar14);
            memmove((void *)((long)pvVar4 + lVar9 * 8 + 0x18),(void *)((long)pvVar4 + 0x18),
                    lVar15 * 8);
            pvVar4 = self->root;
          }
          memset((void *)((long)pvVar4 + 0x18),0,lVar9 << 3);
          *(byte *)(*(long *)self + 0x10) = (byte)uVar14;
          *(char *)(*(long *)self + 0x11) = (char)uVar16;
        }
        *(short *)(*(long *)self + 0x12) = *(short *)(*(long *)self + 0x12) + 1;
        self = (nn_trie *)
               (*(long *)self + ((ulong)bVar7 - (ulong)*(byte *)(*(long *)self + 0x10)) * 8 + 0x18);
      }
      data = pbVar11 + 1;
      size = lVar17 - 1;
      goto LAB_00102862;
    }
    if (size == sVar12) goto LAB_00102909;
    pnVar3 = (nn_trie_node *)nn_node_next(pnVar6,*pbVar11);
    if ((pnVar3 == (nn_trie_node *)0x0) || (*(nn_trie_node **)pnVar3 == (nn_trie_node *)0x0))
    goto LAB_001025b5;
    data = pbVar11 + 1;
    size = lVar17 - 1;
    pnVar6 = *(nn_trie_node **)pnVar3;
    self = (nn_trie *)pnVar3;
  } while( true );
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    pos = 0;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;
    pos = (*node)->prefix_len;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}